

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O1

void __thiscall
OpenMD::CollectiveDipoleDisplacement::CollectiveDipoleDisplacement
          (CollectiveDipoleDisplacement *this,SimInfo *info,string *filename,string *sele1,
          string *sele2)

{
  long *plVar1;
  Thermo *pTVar2;
  long *plVar3;
  string labelString;
  stringstream label;
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  SystemACF<OpenMD::Vector3<double>_>::SystemACF
            (&this->super_SystemACF<OpenMD::Vector3<double>_>,info,filename,sele1,sele2);
  (this->super_SystemACF<OpenMD::Vector3<double>_>).super_AutoCorrFunc<OpenMD::Vector3<double>_>.
  super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__CollectiveDipoleDisplacement_002f3a28;
  (this->CRcm_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CRcm_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CRcm_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CRtot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CRtot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CRtot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CRrot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CRrot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CRrot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Collective Dipole Displacement Function","");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_SystemACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.corrFuncType_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  getPrefix(&local_1d8,
            &(this->super_SystemACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.dumpFilename_);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1a8 = *plVar3;
    lStack_1a0 = plVar1[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar3;
    local_1b8 = (long *)*plVar1;
  }
  local_1b0 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_SystemACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty.outputFilename_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"<|Mtrans(t)-Mtrans(0)|^2>\t",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"<|Mtot(t)-Mtot(0)|^2>\t",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"<|Mrot(t)-Mrot(0)|^2>",0x15);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_SystemACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.labelString_);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->CRcm_,
             (long)(this->super_SystemACF<OpenMD::Vector3<double>_>).
                   super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                   super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_,
             (value_type *)OpenMD::V3Zero);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->CRtot_,
             (long)(this->super_SystemACF<OpenMD::Vector3<double>_>).
                   super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                   super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_,
             (value_type *)OpenMD::V3Zero);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->CRrot_,
             (long)(this->super_SystemACF<OpenMD::Vector3<double>_>).
                   super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                   super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_,
             (value_type *)OpenMD::V3Zero);
  pTVar2 = (Thermo *)operator_new(8);
  pTVar2->info_ =
       (this->super_SystemACF<OpenMD::Vector3<double>_>).
       super_AutoCorrFunc<OpenMD::Vector3<double>_>.super_TimeCorrFunc<OpenMD::Vector3<double>_>.
       info_;
  this->thermo_ = pTVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

CollectiveDipoleDisplacement::CollectiveDipoleDisplacement(
      SimInfo* info, const string& filename, const string& sele1,
      const std::string& sele2) :
      SystemACF<Vector3d>(info, filename, sele1, sele2) {
    setCorrFuncType("Collective Dipole Displacement Function");
    setOutputName(getPrefix(dumpFilename_) + ".ddisp");

    std::stringstream label;
    label << "<|Mtrans(t)-Mtrans(0)|^2>\t"
          << "<|Mtot(t)-Mtot(0)|^2>\t"
          << "<|Mrot(t)-Mrot(0)|^2>";
    const std::string labelString = label.str();
    setLabelString(labelString);

    CRcm_.resize(nFrames_, V3Zero);
    CRtot_.resize(nFrames_, V3Zero);
    CRrot_.resize(nFrames_, V3Zero);

    // We'll need thermo to compute the volume:
    thermo_ = new Thermo(info_);
  }